

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O1

int run_test_fs_poll_close_request_multi_start_stop(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  code *unaff_RBX;
  uint uVar3;
  ulong unaff_RBP;
  char *unaff_R14;
  long *unaff_R15;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  long alStack_ac8 [9];
  undefined1 auStack_a80 [808];
  code *pcStack_758;
  long lStack_748;
  long lStack_740;
  long alStack_738 [9];
  undefined1 auStack_6f0 [808];
  code *pcStack_3c8;
  char *pcStack_3c0;
  long *plStack_3b8;
  code *pcStack_3b0;
  long local_3a0;
  long local_398;
  long local_390 [9];
  undefined1 local_348 [808];
  
  pcStack_3b0 = (code *)0x18ae01;
  remove("testfile");
  pcStack_3b0 = (code *)0x18ae0b;
  iVar1 = uv_loop_init(local_348);
  local_390[0] = (long)iVar1;
  local_3a0 = 0;
  if (local_390[0] == 0) {
    pcStack_3b0 = (code *)0x18ae3a;
    iVar1 = uv_fs_poll_init(local_348,local_390);
    local_3a0 = (long)iVar1;
    local_398 = 0;
    if (local_3a0 != 0) goto LAB_0018afae;
    unaff_RBP = 10;
    unaff_RBX = poll_cb_fail;
    unaff_R14 = "testfile";
    unaff_R15 = local_390;
    do {
      local_3a0 = 0;
      local_398 = 0;
      pcStack_3b0 = (code *)0x18ae85;
      iVar1 = uv_fs_poll_start(unaff_R15,poll_cb_fail,"testfile",100);
      local_3a0 = (long)iVar1;
      local_398 = 0;
      if (local_3a0 != 0) {
LAB_0018af90:
        pcStack_3b0 = (code *)0x18af9f;
        run_test_fs_poll_close_request_multi_start_stop_cold_3();
        goto LAB_0018af9f;
      }
      pcStack_3b0 = (code *)0x18aead;
      iVar1 = uv_fs_poll_stop(unaff_R15);
      local_3a0 = (long)iVar1;
      local_398 = 0;
      if (local_3a0 != 0) {
        pcStack_3b0 = (code *)0x18af90;
        run_test_fs_poll_close_request_multi_start_stop_cold_4();
        goto LAB_0018af90;
      }
      uVar3 = (int)unaff_RBP - 1;
      unaff_RBP = (ulong)uVar3;
    } while (uVar3 != 0);
    pcStack_3b0 = (code *)0x18aee2;
    uv_close(local_390,close_cb);
    if (close_cb_called == 0) {
      unaff_RBX = (code *)local_348;
      do {
        pcStack_3b0 = (code *)0x18aefe;
        uv_run(unaff_RBX,1);
      } while (close_cb_called == 0);
    }
    local_3a0 = 1;
    local_398 = (long)close_cb_called;
    if (local_398 != 1) goto LAB_0018afbd;
    unaff_RBX = (code *)local_348;
    pcStack_3b0 = (code *)0x18af3e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_3b0 = (code *)0x18af48;
    uv_run(unaff_RBX,0);
    local_3a0 = 0;
    pcStack_3b0 = (code *)0x18af59;
    iVar1 = uv_loop_close(unaff_RBX);
    local_398 = (long)iVar1;
    if (local_3a0 == local_398) {
      pcStack_3b0 = (code *)0x18af71;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_0018af9f:
    pcStack_3b0 = (code *)0x18afae;
    run_test_fs_poll_close_request_multi_start_stop_cold_1();
LAB_0018afae:
    pcStack_3b0 = (code *)0x18afbd;
    run_test_fs_poll_close_request_multi_start_stop_cold_2();
LAB_0018afbd:
    pcStack_3b0 = (code *)0x18afcc;
    run_test_fs_poll_close_request_multi_start_stop_cold_5();
  }
  pcStack_3b0 = run_test_fs_poll_close_request_multi_stop_start;
  run_test_fs_poll_close_request_multi_start_stop_cold_6();
  pcStack_758 = (code *)0x18aff4;
  pcStack_3c8 = unaff_RBX;
  pcStack_3c0 = unaff_R14;
  plStack_3b8 = unaff_R15;
  pcStack_3b0 = (code *)unaff_RBP;
  remove("testfile");
  pcStack_758 = (code *)0x18affe;
  iVar1 = uv_loop_init(auStack_6f0);
  alStack_738[0] = (long)iVar1;
  lStack_748 = 0;
  if (alStack_738[0] == 0) {
    pcStack_758 = (code *)0x18b02d;
    iVar1 = uv_fs_poll_init(auStack_6f0,alStack_738);
    lStack_748 = (long)iVar1;
    lStack_740 = 0;
    if (lStack_748 != 0) goto LAB_0018b1a1;
    iVar1 = 10;
    unaff_RBX = (code *)alStack_738;
    do {
      lStack_748 = 0;
      lStack_740 = 0;
      pcStack_758 = (code *)0x18b06d;
      iVar2 = uv_fs_poll_stop(unaff_RBX);
      lStack_748 = (long)iVar2;
      lStack_740 = 0;
      if (lStack_748 != 0) {
LAB_0018b183:
        pcStack_758 = (code *)0x18b192;
        run_test_fs_poll_close_request_multi_stop_start_cold_3();
        goto LAB_0018b192;
      }
      pcStack_758 = (code *)0x18b0a0;
      iVar2 = uv_fs_poll_start(unaff_RBX,poll_cb_fail,"testfile",100);
      lStack_748 = (long)iVar2;
      lStack_740 = 0;
      if (lStack_748 != 0) {
        pcStack_758 = (code *)0x18b183;
        run_test_fs_poll_close_request_multi_stop_start_cold_4();
        goto LAB_0018b183;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    pcStack_758 = (code *)0x18b0d5;
    uv_close(alStack_738,close_cb);
    if (close_cb_called == 0) {
      unaff_RBX = (code *)auStack_6f0;
      do {
        pcStack_758 = (code *)0x18b0f1;
        uv_run(unaff_RBX,1);
      } while (close_cb_called == 0);
    }
    lStack_748 = 1;
    lStack_740 = (long)close_cb_called;
    if (lStack_740 != 1) goto LAB_0018b1b0;
    unaff_RBX = (code *)auStack_6f0;
    pcStack_758 = (code *)0x18b131;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_758 = (code *)0x18b13b;
    uv_run(unaff_RBX,0);
    lStack_748 = 0;
    pcStack_758 = (code *)0x18b14c;
    iVar1 = uv_loop_close(unaff_RBX);
    lStack_740 = (long)iVar1;
    if (lStack_748 == lStack_740) {
      pcStack_758 = (code *)0x18b164;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_0018b192:
    pcStack_758 = (code *)0x18b1a1;
    run_test_fs_poll_close_request_multi_stop_start_cold_1();
LAB_0018b1a1:
    pcStack_758 = (code *)0x18b1b0;
    run_test_fs_poll_close_request_multi_stop_start_cold_2();
LAB_0018b1b0:
    pcStack_758 = (code *)0x18b1bf;
    run_test_fs_poll_close_request_multi_stop_start_cold_5();
  }
  pcStack_758 = run_test_fs_poll_close_request_stop_when_active;
  run_test_fs_poll_close_request_multi_stop_start_cold_6();
  pcStack_758 = unaff_RBX;
  remove("testfile");
  iVar1 = uv_loop_init(auStack_a80);
  alStack_ac8[0] = (long)iVar1;
  if (alStack_ac8[0] == 0) {
    iVar1 = uv_fs_poll_init(auStack_a80,alStack_ac8);
    if (iVar1 != 0) goto LAB_0018b35b;
    iVar1 = uv_fs_poll_start(alStack_ac8,poll_cb_noop,"testfile",100);
    if (iVar1 != 0) goto LAB_0018b368;
    uv_run(auStack_a80,1);
    iVar1 = uv_fs_poll_stop(alStack_ac8);
    if (iVar1 != 0) goto LAB_0018b375;
    uv_run(auStack_a80,1);
    uv_close(alStack_ac8,close_cb);
    uv_run(auStack_a80,1);
    if (close_cb_called == 1) {
      uv_walk(auStack_a80,close_walk_cb,0);
      uv_run(auStack_a80,0);
      iVar1 = uv_loop_close(auStack_a80);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018b38f;
    }
  }
  else {
    run_test_fs_poll_close_request_stop_when_active_cold_1();
LAB_0018b35b:
    run_test_fs_poll_close_request_stop_when_active_cold_2();
LAB_0018b368:
    run_test_fs_poll_close_request_stop_when_active_cold_3();
LAB_0018b375:
    run_test_fs_poll_close_request_stop_when_active_cold_4();
  }
  run_test_fs_poll_close_request_stop_when_active_cold_5();
LAB_0018b38f:
  run_test_fs_poll_close_request_stop_when_active_cold_6();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_poll_close_request_multi_start_stop) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;
  int i;

  remove(FIXTURE);

  ASSERT_OK(uv_loop_init(&loop));

  ASSERT_OK(uv_fs_poll_init(&loop, &poll_handle));

  for (i = 0; i < 10; ++i) {
    ASSERT_OK(uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
    ASSERT_OK(uv_fs_poll_stop(&poll_handle));
  }
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}